

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSM_tree.cpp
# Opt level: O2

bool __thiscall LSM_tree::del(LSM_tree *this,uint64_t key)

{
  bool bVar1;
  string s;
  
  bVar1 = find(this,key);
  if (bVar1) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    put(this,key,&s,true);
    std::__cxx11::string::~string((string *)&s);
  }
  return bVar1;
}

Assistant:

bool LSM_tree::del(uint64_t key) {
    //这个find是找 确实有没有这个 如果memtable有key 但标为被删就算没找到
    //如果要去文件里找看最大时间码的有没有标记未被删了的
    //cout<<"del"<<key<<endl;
    if (!find(key)) return false;
    std::string s;
    put(key, s, true);
    return true;
}